

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

bool embree::TutorialBenchmark::benchmark(int argc,char **argv)

{
  long in_RSI;
  int in_EDI;
  int i;
  undefined7 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  int local_8;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    if (local_8 <= local_14) {
      return false;
    }
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (local_10 + (long)local_14 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,(char *)__lhs,&local_39);
    in_stack_ffffffffffffff9f =
         std::operator==(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
                        );
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if ((in_stack_ffffffffffffff9f & 1) != 0) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

static bool benchmark(int argc, char** argv) {
    for (int i = 0; i < argc; ++i)
      if (std::string(argv[i]) == "--benchmark")
        return true;
    return false;
  }